

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Entry * __thiscall
kj::Vector<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
add<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry>
          (Vector<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry> *this,
          Entry *params)

{
  Entry *pEVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  
  puVar3 = *(unsigned_long **)(this + 8);
  if (puVar3 == *(unsigned_long **)(this + 0x10)) {
    Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::grow
              ((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *
               )this,0);
    puVar3 = *(unsigned_long **)(this + 8);
  }
  uVar2 = *(unsigned_long *)&params->value;
  *puVar3 = params->key;
  puVar3[1] = uVar2;
  pEVar1 = *(Entry **)(this + 8);
  *(Entry **)(this + 8) = pEVar1 + 1;
  return pEVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }